

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-tree.h
# Opt level: O1

StringTree * __thiscall
kj::StringTree::
concat<kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::StringTree,kj::StringTree,kj::StringTree>
          (StringTree *__return_storage_ptr__,StringTree *this,ArrayPtr<const_char> *params,
          ArrayPtr<const_char> *params_1,StringTree *params_2,StringTree *params_3,
          StringTree *params_4)

{
  ArrayDisposer *pAVar1;
  Branch *pBVar2;
  char *__n;
  size_t __n_00;
  size_t sVar3;
  long lVar4;
  size_t result_2;
  char *pcVar5;
  String local_88;
  char *local_68;
  size_t sStack_60;
  char *local_58;
  size_t sStack_50;
  size_t local_48;
  StringTree *local_40;
  ArrayPtr<const_char> *local_38;
  
  (__return_storage_ptr__->branches).ptr = (Branch *)0x0;
  (__return_storage_ptr__->branches).size_ = 0;
  (__return_storage_ptr__->text).content.size_ = 0;
  (__return_storage_ptr__->text).content.disposer = (ArrayDisposer *)0x0;
  __return_storage_ptr__->size_ = 0;
  (__return_storage_ptr__->text).content.ptr = (char *)0x0;
  (__return_storage_ptr__->branches).disposer = (ArrayDisposer *)0x0;
  local_68 = (this->text).content.ptr;
  sStack_60 = params->size_;
  local_58 = params_1->ptr;
  sStack_50 = params_2->size_;
  local_48 = params_3->size_;
  sVar3 = 0;
  lVar4 = 0;
  do {
    sVar3 = sVar3 + *(long *)((long)&local_68 + lVar4);
    lVar4 = lVar4 + 8;
  } while (lVar4 != 0x28);
  __return_storage_ptr__->size_ = sVar3;
  local_58 = (char *)0x0;
  sStack_50 = 0;
  local_48 = 0;
  sVar3 = 0;
  lVar4 = 0;
  do {
    sVar3 = sVar3 + *(long *)((long)&local_68 + lVar4);
    lVar4 = lVar4 + 8;
  } while (lVar4 != 0x28);
  local_38 = params;
  heapString(&local_88,sVar3);
  pcVar5 = (__return_storage_ptr__->text).content.ptr;
  if (pcVar5 != (char *)0x0) {
    sVar3 = (__return_storage_ptr__->text).content.size_;
    (__return_storage_ptr__->text).content.ptr = (char *)0x0;
    (__return_storage_ptr__->text).content.size_ = 0;
    pAVar1 = (__return_storage_ptr__->text).content.disposer;
    (*(code *)**(undefined8 **)pAVar1)(pAVar1,pcVar5,1,sVar3,sVar3,0);
  }
  (__return_storage_ptr__->text).content.ptr = local_88.content.ptr;
  (__return_storage_ptr__->text).content.size_ = local_88.content.size_;
  (__return_storage_ptr__->text).content.disposer = local_88.content.disposer;
  local_68 = (char *)0x0;
  sStack_60 = 0;
  local_58 = (char *)0x1;
  sStack_50 = 1;
  local_48 = 1;
  sVar3 = 0;
  lVar4 = 0;
  do {
    sVar3 = sVar3 + *(long *)((long)&local_68 + lVar4);
    lVar4 = lVar4 + 8;
  } while (lVar4 != 0x28);
  local_40 = (StringTree *)params_1;
  local_88.content.ptr =
       (char *)_::HeapArrayDisposer::allocateImpl
                         (0x40,sVar3,sVar3,
                          _::HeapArrayDisposer::Allocate_<kj::StringTree::Branch,_false,_false>::
                          construct,
                          _::HeapArrayDisposer::Allocate_<kj::StringTree::Branch,_false,_false>::
                          destruct);
  local_88.content.disposer = (ArrayDisposer *)&_::HeapArrayDisposer::instance;
  pBVar2 = (__return_storage_ptr__->branches).ptr;
  local_88.content.size_ = sVar3;
  if (pBVar2 != (Branch *)0x0) {
    sVar3 = (__return_storage_ptr__->branches).size_;
    (__return_storage_ptr__->branches).ptr = (Branch *)0x0;
    (__return_storage_ptr__->branches).size_ = 0;
    pAVar1 = (__return_storage_ptr__->branches).disposer;
    (*(code *)**(undefined8 **)pAVar1)
              (pAVar1,pBVar2,0x40,sVar3,sVar3,
               ArrayDisposer::Dispose_<kj::StringTree::Branch,_false>::destruct);
  }
  (__return_storage_ptr__->branches).ptr = (Branch *)local_88.content.ptr;
  (__return_storage_ptr__->branches).size_ = local_88.content.size_;
  (__return_storage_ptr__->branches).disposer = local_88.content.disposer;
  pcVar5 = (char *)(__return_storage_ptr__->text).content.size_;
  if (pcVar5 != (char *)0x0) {
    pcVar5 = (__return_storage_ptr__->text).content.ptr;
  }
  __n = (this->text).content.ptr;
  if (__n != (char *)0x0) {
    memcpy(pcVar5,(void *)this->size_,(size_t)__n);
    pcVar5 = pcVar5 + (long)__n;
  }
  __n_00 = local_38->size_;
  if (__n_00 != 0) {
    memcpy(pcVar5,local_38->ptr,__n_00);
    pcVar5 = pcVar5 + __n_00;
  }
  fill<kj::StringTree,kj::StringTree>(__return_storage_ptr__,pcVar5,0,local_40,params_2,params_3);
  return __return_storage_ptr__;
}

Assistant:

StringTree StringTree::concat(Params&&... params) {
  StringTree result;
  result.size_ = _::sum({params.size()...});
  result.text = heapString(
      _::sum({StringTree::flatSize(kj::fwd<Params>(params))...}));
  result.branches = heapArray<StringTree::Branch>(
      _::sum({StringTree::branchCount(kj::fwd<Params>(params))...}));
  result.fill(result.text.begin(), 0, kj::fwd<Params>(params)...);
  return result;
}